

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O1

bool __thiscall
boost::runtime::value_interpreter<bool,_false>::interpret
          (value_interpreter<bool,_false> *this,cstring *param_name,cstring *source)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  long lVar8;
  undefined **local_c0;
  iterator local_b8;
  iterator pvStack_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_88;
  format_error local_50;
  
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_YES == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_Y == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_NO == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_N == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_TRUE == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_FALSE == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_one == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_zero == '\0') {
    value_interpreter<bool,false>::interpret();
  }
  pcVar3 = source->m_end;
  pcVar2 = source->m_begin;
  pcVar4 = pcVar2;
  for (; pcVar2 != pcVar3; pcVar2 = pcVar2 + 1) {
    lVar8 = 0;
    while ((&unit_test::basic_cstring<char_const>::default_trim_ex()::ws)[lVar8] != *pcVar2) {
      lVar8 = lVar8 + 1;
      pcVar4 = pcVar2;
      if (lVar8 == 3) goto LAB_0018901b;
    }
    pcVar4 = pcVar3;
  }
LAB_0018901b:
  pcVar2 = pcVar4;
  if (pcVar3 <= pcVar4) {
    pcVar2 = pcVar3;
  }
  source->m_begin = pcVar2;
  pcVar5 = pcVar3;
  if (pcVar4 < pcVar3) {
    do {
      pcVar4 = pcVar3 + -1;
      lVar8 = 0;
      while ((&unit_test::basic_cstring<char_const>::default_trim_ex()::ws)[lVar8] != pcVar3[-1]) {
        lVar8 = lVar8 + 1;
        pcVar5 = pcVar3;
        if (lVar8 == 3) goto LAB_00189059;
      }
      pcVar5 = pcVar2;
      pcVar3 = pcVar4;
    } while (pcVar4 != pcVar2);
  }
LAB_00189059:
  source->m_end = pcVar5;
  if (pcVar5 <= pcVar2) {
    source->m_begin = pcVar5;
  }
  bVar7 = true;
  sVar6 = (long)pcVar5 - (long)source->m_begin;
  if ((sVar6 != 0) &&
     ((sVar6 != (long)interpret::s_YES.m_end - (long)interpret::s_YES.m_begin ||
      (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                         (source->m_begin,interpret::s_YES.m_begin,sVar6), iVar1 != 0)))) {
    sVar6 = (long)source->m_end - (long)source->m_begin;
    if ((sVar6 != (long)interpret::s_Y.m_end - (long)interpret::s_Y.m_begin) ||
       (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                          (source->m_begin,interpret::s_Y.m_begin,sVar6), iVar1 != 0)) {
      sVar6 = (long)source->m_end - (long)source->m_begin;
      if ((sVar6 != (long)interpret::s_one.m_end - (long)interpret::s_one.m_begin) ||
         (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                            (source->m_begin,interpret::s_one.m_begin,sVar6), iVar1 != 0)) {
        sVar6 = (long)source->m_end - (long)source->m_begin;
        if ((sVar6 != (long)interpret::s_TRUE.m_end - (long)interpret::s_TRUE.m_begin) ||
           (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                              (source->m_begin,interpret::s_TRUE.m_begin,sVar6), iVar1 != 0)) {
          sVar6 = (long)source->m_end - (long)source->m_begin;
          if ((sVar6 != (long)interpret::s_NO.m_end - (long)interpret::s_NO.m_begin) ||
             (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                                (source->m_begin,interpret::s_NO.m_begin,sVar6), iVar1 != 0)) {
            sVar6 = (long)source->m_end - (long)source->m_begin;
            if ((sVar6 != (long)interpret::s_N.m_end - (long)interpret::s_N.m_begin) ||
               (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                                  (source->m_begin,interpret::s_N.m_begin,sVar6), iVar1 != 0)) {
              sVar6 = (long)source->m_end - (long)source->m_begin;
              if ((sVar6 != (long)interpret::s_zero.m_end - (long)interpret::s_zero.m_begin) ||
                 (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                                    (source->m_begin,interpret::s_zero.m_begin,sVar6), iVar1 != 0))
              {
                sVar6 = (long)source->m_end - (long)source->m_begin;
                if ((sVar6 != (long)interpret::s_FALSE.m_end - (long)interpret::s_FALSE.m_begin) ||
                   (iVar1 = unit_test::ut_detail::case_ins<const_char>::compare
                                      (source->m_begin,interpret::s_FALSE.m_begin,sVar6), iVar1 != 0
                   )) {
                  local_a8 = local_98;
                  local_b8 = param_name->m_begin;
                  pvStack_b0 = param_name->m_end;
                  local_a0 = 0;
                  local_98[0] = 0;
                  local_c0 = &PTR__param_error_001cc128;
                  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                  operator<<((format_error *)&local_88,
                             (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                              *)&local_c0,source);
                  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                  operator<<(&local_50,&local_88," can\'t be interpreted as bool value.");
                  unit_test::ut_detail::throw_exception<boost::runtime::format_error>(&local_50);
                }
              }
            }
          }
          bVar7 = false;
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool    interpret( cstring param_name, cstring source ) const
    {
        static cstring const s_YES( "YES" );
        static cstring const s_Y( "Y" );
        static cstring const s_NO( "NO" );
        static cstring const s_N( "N" );
        static cstring const s_TRUE( "TRUE" );
        static cstring const s_FALSE( "FALSE" );
        static cstring const s_one( "1" );
        static cstring const s_zero( "0" );

        source.trim();

        if( source.is_empty() ||
            case_ins_eq( source, s_YES ) ||
            case_ins_eq( source, s_Y ) ||
            case_ins_eq( source, s_one ) ||
            case_ins_eq( source, s_TRUE ) )
            return true;

        if( case_ins_eq( source, s_NO ) ||
            case_ins_eq( source, s_N ) ||
            case_ins_eq( source, s_zero ) ||
            case_ins_eq( source, s_FALSE ) )
            return false;

        BOOST_TEST_I_THROW( format_error( param_name ) << source << " can't be interpreted as bool value." );
    }